

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateDebugInfoOperand
          (ValidationState_t *_,string *debug_inst_name,
          CommonDebugInfoInstructions expected_debug_inst,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  DiagnosticStream *pDVar3;
  spv_ext_inst_desc desc;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DiagnosticStream local_208;
  
  local_248._8_8_ = 0;
  local_248._4_4_ = 0;
  local_248._0_4_ = expected_debug_inst;
  local_230 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
              ::_M_manager;
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)&local_248,inst,word_index);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    desc = (spv_ext_inst_desc)0x0;
    sVar2 = AssemblyGrammar::lookupExtInst
                      (&_->grammar_,(inst->inst_).ext_inst_type,expected_debug_inst,&desc);
    if ((sVar2 == SPV_SUCCESS) && (desc != (spv_ext_inst_desc)0x0)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_228,ext_inst_name);
      std::operator<<((ostream *)&local_208,(string *)&local_228);
      std::operator<<((ostream *)&local_208,": ");
      std::operator<<((ostream *)&local_208,"expected operand ");
      std::operator<<((ostream *)&local_208,(string *)debug_inst_name);
      std::operator<<((ostream *)&local_208," must be a result id of ");
      pDVar3 = DiagnosticStream::operator<<(&local_208,&desc->name);
      sVar2 = pDVar3->error_;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_228,ext_inst_name);
      std::operator<<((ostream *)&local_208,(string *)&local_228);
      std::operator<<((ostream *)&local_208,": ");
      std::operator<<((ostream *)&local_208,"expected operand ");
      std::operator<<((ostream *)&local_208,(string *)debug_inst_name);
      std::operator<<((ostream *)&local_208," is invalid");
      sVar2 = local_208.error_;
    }
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateDebugInfoOperand(
    ValidationState_t& _, const std::string& debug_inst_name,
    CommonDebugInfoInstructions expected_debug_inst, const Instruction* inst,
    uint32_t word_index, const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [expected_debug_inst](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == expected_debug_inst;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(inst->ext_inst_type(), expected_debug_inst,
                                &desc) != SPV_SUCCESS ||
      !desc) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << debug_inst_name << " is invalid";
  }
  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name << " must be a result id of "
         << desc->name;
}